

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O2

int __thiscall ArgParser::ArgIterator::count(ArgIterator *this)

{
  char *pcVar1;
  logic_error *this_00;
  code *pcVar2;
  char *pcVar3;
  undefined *puVar4;
  
  if (this->i == this->argc) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error((range_error *)this_00,"arg out of range");
    puVar4 = &std::range_error::typeinfo;
    pcVar2 = std::range_error::~range_error;
  }
  else {
    if (this->longmatch == true) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"can\'t count a --long option");
    }
    else {
      pcVar1 = this->p;
      pcVar3 = pcVar1;
      do {
        pcVar3 = pcVar3 + 1;
        if (pcVar3 == this->pend) {
          return (int)this->pend + ~(uint)pcVar1;
        }
      } while (*pcVar3 == pcVar1[1]);
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"counted options must all be equal");
    }
    puVar4 = &std::logic_error::typeinfo;
    pcVar2 = std::logic_error::~logic_error;
  }
  __cxa_throw(this_00,puVar4,pcVar2);
}

Assistant:

int count()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (longmatch)
                throw std::logic_error("can't count a --long option");
            char opt = p[1];
            const char *q = p+1;

            while (q!=pend && *q==opt)
                ++q;

            if (q!=pend)
                throw std::logic_error("counted options must all be equal");

            return pend - p - 1;
        }